

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O0

zt_ptr_array * zt_cstr_split(char *str,char *delim)

{
  int iVar1;
  zt_ptr_array *pzVar2;
  char *in_RSI;
  char *in_RDI;
  zt_ptr_array *split_array;
  char *tok;
  char *endptr;
  char *str_copy;
  zt_ptr_array *in_stack_ffffffffffffffb8;
  zt_ptr_array_free_cb in_stack_ffffffffffffffc0;
  int free_members;
  void *in_stack_ffffffffffffffc8;
  char *local_30;
  char *local_28;
  char *local_20;
  char *local_18;
  char *local_10;
  zt_ptr_array *local_8;
  
  if ((in_RDI == (char *)0x0) || (in_RSI == (char *)0x0)) {
    local_8 = (zt_ptr_array *)0x0;
  }
  else {
    local_18 = in_RSI;
    local_10 = in_RDI;
    pzVar2 = zt_ptr_array_init(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    local_28 = (char *)0x0;
    local_20 = strdup(local_10);
    local_30 = strtok_r(local_20,local_18,&local_28);
    local_8 = pzVar2;
    while (local_30 != (char *)0x0) {
      pzVar2 = local_8;
      strdup(local_30);
      free_members = (int)((ulong)local_8 >> 0x20);
      iVar1 = zt_ptr_array_add(in_stack_ffffffffffffffb8,(void *)0x1419db);
      if (iVar1 < 0) {
        zt_ptr_array_free(pzVar2,free_members);
        free(local_20);
        return (zt_ptr_array *)0x0;
      }
      local_30 = strtok_r((char *)0x0,local_18,&local_28);
      local_8 = pzVar2;
    }
    free(local_20);
  }
  return local_8;
}

Assistant:

zt_ptr_array *
zt_cstr_split(const char *str, const char *delim) {
    char         *str_copy;
    char         *endptr;
    char         *tok;
    zt_ptr_array *split_array;

    if (str == NULL || delim == NULL) {
        return NULL;
    }

    split_array = zt_ptr_array_init(NULL, (zt_ptr_array_free_cb)free);

    endptr      = NULL;

    str_copy    = strdup(str);

    for (tok = strtok_r(str_copy, delim, &endptr); tok != NULL; tok = strtok_r(NULL, delim, &endptr)) {
        if (zt_ptr_array_add(split_array, (void *)strdup(tok)) < 0) {
            zt_ptr_array_free(split_array, 1);
            free(str_copy);
            return NULL;
        }
    }

    free(str_copy);

    return split_array;
}